

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlnode.cpp
# Opt level: O1

string * __thiscall
libcellml::XmlNode::attribute_abi_cxx11_
          (string *__return_storage_ptr__,XmlNode *this,char *attributeName)

{
  long lVar1;
  char *__s;
  allocator<char> local_41;
  long *local_40 [2];
  long local_30 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar1 = xmlHasProp(this->mPimpl->mXmlNodePtr,attributeName);
  if (lVar1 != 0) {
    __s = (char *)xmlGetProp(this->mPimpl->mXmlNodePtr,attributeName);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_40,__s,&local_41);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    (*_xmlFree)(__s);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string XmlNode::attribute(const char *attributeName) const
{
    std::string attributeValueString;
    if (hasAttribute(attributeName)) {
        xmlChar *attributeValue = xmlGetProp(mPimpl->mXmlNodePtr, reinterpret_cast<const xmlChar *>(attributeName));
        attributeValueString = std::string(reinterpret_cast<const char *>(attributeValue));
        xmlFree(attributeValue);
    }
    return attributeValueString;
}